

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O1

void __thiscall Fifteen::slotReadBoard(Fifteen *this)

{
  Controller *this_00;
  QArrayData *pQVar1;
  size_type sVar2;
  bool bVar3;
  char16_t *pcVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QString file;
  QString local_b8;
  string local_98;
  QArrayData *local_78;
  char16_t *pcStack_70;
  size_type local_68;
  QArrayData *local_58;
  char16_t *pcStack_50;
  size_type local_48;
  QArrayData *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  QVar5.m_data = (storage_type *)0x0;
  QVar5.m_size = (qsizetype)&local_98;
  QString::fromUtf8(QVar5);
  local_78 = (QArrayData *)local_98._M_dataplus._M_p;
  pcStack_70 = (char16_t *)local_98._M_string_length;
  local_68 = local_98.field_2._M_allocated_capacity;
  QVar6.m_data = (storage_type *)0x0;
  QVar6.m_size = (qsizetype)&local_98;
  QString::fromUtf8(QVar6);
  local_58 = (QArrayData *)local_98._M_dataplus._M_p;
  pcStack_50 = (char16_t *)local_98._M_string_length;
  local_48 = local_98.field_2._M_allocated_capacity;
  QDir::currentPath();
  local_38 = (QArrayData *)0x0;
  uStack_30 = 0;
  local_28 = 0;
  QFileDialog::getOpenFileName(&local_b8,this,&local_58,&local_98,&local_38,0,0);
  sVar2 = local_68;
  pcVar4 = pcStack_70;
  pQVar1 = local_78;
  local_78 = &(local_b8.d.d)->super_QArrayData;
  local_b8.d.d = (Data *)pQVar1;
  pcStack_70 = local_b8.d.ptr;
  local_68 = local_b8.d.size;
  local_b8.d.ptr = pcVar4;
  local_b8.d.size = sVar2;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,8);
    }
  }
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  if ((QArrayData *)local_98._M_dataplus._M_p != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_98._M_dataplus._M_p = *(int *)local_98._M_dataplus._M_p + -1;
    UNLOCK();
    if (*(int *)local_98._M_dataplus._M_p == 0) {
      QArrayData::deallocate((QArrayData *)local_98._M_dataplus._M_p,2,8);
    }
  }
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,8);
    }
  }
  if (local_68 != 0) {
    this_00 = (this->controller)._M_t.
              super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
              super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
              super__Head_base<0UL,_Controller_*,_false>._M_head_impl;
    QString::toUtf8_helper(&local_b8);
    pcVar4 = local_b8.d.ptr;
    if (local_b8.d.ptr == (char16_t *)0x0) {
      pcVar4 = (char16_t *)&QByteArray::_empty;
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,pcVar4,local_b8.d.size + (long)pcVar4);
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,1,8);
      }
    }
    bVar3 = Controller::readBoardFromFile(this_00,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      createTiles(this);
      setTiles(this);
    }
    else {
      QVar7.m_data = (storage_type *)0x0;
      QVar7.m_size = (qsizetype)&local_98;
      QString::fromUtf8(QVar7);
      local_b8.d.d = (Data *)local_98._M_dataplus._M_p;
      local_b8.d.ptr = (char16_t *)local_98._M_string_length;
      local_b8.d.size = local_98.field_2._M_allocated_capacity;
      Message::getMessages();
      QMessageBox::information(this,&local_b8,&local_98,0x400,0);
      if ((QArrayData *)local_98._M_dataplus._M_p != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_98._M_dataplus._M_p = *(int *)local_98._M_dataplus._M_p + -1;
        UNLOCK();
        if (*(int *)local_98._M_dataplus._M_p == 0) {
          QArrayData::deallocate((QArrayData *)local_98._M_dataplus._M_p,2,8);
        }
      }
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,8);
        }
      }
    }
  }
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,2,8);
    }
  }
  return;
}

Assistant:

void Fifteen::slotReadBoard()
{    
    QString file = nullptr;
    if ( file = QFileDialog::getOpenFileName( this, "", QDir::currentPath() );
         file.isEmpty() )
    {
        return;
    }

    if ( controller->readBoardFromFile( file.toStdString() ) == false)
    {
        QMessageBox::information( this, "", Message::getMessages() );
        return;
    }
    redrawTiles();
}